

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O0

bool nullcInitMathModule(void)

{
  nullres nVar1;
  bool local_9;
  
  nVar1 = nullcBindModuleFunctionHelper<double,double>("std.math",NULLCMath::Cos,"cos",0);
  if (nVar1 == '\0') {
    local_9 = false;
  }
  else {
    nullcSetModuleFunctionAttribute("std.math","cos",0,0,1);
    nVar1 = nullcBindModuleFunctionHelper<double,double>("std.math",NULLCMath::Sin,"sin",0);
    if (nVar1 == '\0') {
      local_9 = false;
    }
    else {
      nullcSetModuleFunctionAttribute("std.math","sin",0,0,1);
      nVar1 = nullcBindModuleFunctionHelper<double,double>("std.math",NULLCMath::Tan,"tan",0);
      if (nVar1 == '\0') {
        local_9 = false;
      }
      else {
        nullcSetModuleFunctionAttribute("std.math","tan",0,0,1);
        nVar1 = nullcBindModuleFunctionHelper<double,double>("std.math",NULLCMath::Ctg,"ctg",0);
        if (nVar1 == '\0') {
          local_9 = false;
        }
        else {
          nullcSetModuleFunctionAttribute("std.math","ctg",0,0,1);
          nVar1 = nullcBindModuleFunctionHelper<double,double>("std.math",NULLCMath::Cosh,"cosh",0);
          if (nVar1 == '\0') {
            local_9 = false;
          }
          else {
            nullcSetModuleFunctionAttribute("std.math","cosh",0,0,1);
            nVar1 = nullcBindModuleFunctionHelper<double,double>
                              ("std.math",NULLCMath::Sinh,"sinh",0);
            if (nVar1 == '\0') {
              local_9 = false;
            }
            else {
              nullcSetModuleFunctionAttribute("std.math","sinh",0,0,1);
              nVar1 = nullcBindModuleFunctionHelper<double,double>
                                ("std.math",NULLCMath::Tanh,"tanh",0);
              if (nVar1 == '\0') {
                local_9 = false;
              }
              else {
                nullcSetModuleFunctionAttribute("std.math","tanh",0,0,1);
                nVar1 = nullcBindModuleFunctionHelper<double,double>
                                  ("std.math",NULLCMath::Coth,"coth",0);
                if (nVar1 == '\0') {
                  local_9 = false;
                }
                else {
                  nullcSetModuleFunctionAttribute("std.math","coth",0,0,1);
                  nVar1 = nullcBindModuleFunctionHelper<double,double>
                                    ("std.math",NULLCMath::Acos,"acos",0);
                  if (nVar1 == '\0') {
                    local_9 = false;
                  }
                  else {
                    nullcSetModuleFunctionAttribute("std.math","acos",0,0,1);
                    nVar1 = nullcBindModuleFunctionHelper<double,double>
                                      ("std.math",NULLCMath::Asin,"asin",0);
                    if (nVar1 == '\0') {
                      local_9 = false;
                    }
                    else {
                      nullcSetModuleFunctionAttribute("std.math","asin",0,0,1);
                      nVar1 = nullcBindModuleFunctionHelper<double,double>
                                        ("std.math",NULLCMath::Atan,"atan",0);
                      if (nVar1 == '\0') {
                        local_9 = false;
                      }
                      else {
                        nullcSetModuleFunctionAttribute("std.math","atan",0,0,1);
                        nVar1 = nullcBindModuleFunctionHelper<double,double,double>
                                          ("std.math",NULLCMath::Atan2,"atan2",0);
                        if (nVar1 == '\0') {
                          local_9 = false;
                        }
                        else {
                          nullcSetModuleFunctionAttribute("std.math","atan2",0,0,1);
                          nVar1 = nullcBindModuleFunctionHelper<double,double>
                                            ("std.math",NULLCMath::Ceil,"ceil",0);
                          if (nVar1 == '\0') {
                            local_9 = false;
                          }
                          else {
                            nullcSetModuleFunctionAttribute("std.math","ceil",0,0,1);
                            nVar1 = nullcBindModuleFunctionHelper<double,double>
                                              ("std.math",NULLCMath::Floor,"floor",0);
                            if (nVar1 == '\0') {
                              local_9 = false;
                            }
                            else {
                              nullcSetModuleFunctionAttribute("std.math","floor",0,0,1);
                              nVar1 = nullcBindModuleFunctionHelper<double,double>
                                                ("std.math",NULLCMath::Exp,"exp",0);
                              if (nVar1 == '\0') {
                                local_9 = false;
                              }
                              else {
                                nullcSetModuleFunctionAttribute("std.math","exp",0,0,1);
                                nVar1 = nullcBindModuleFunctionHelper<double,double>
                                                  ("std.math",NULLCMath::Log,"log",0);
                                if (nVar1 == '\0') {
                                  local_9 = false;
                                }
                                else {
                                  nullcSetModuleFunctionAttribute("std.math","log",0,0,1);
                                  nVar1 = nullcBindModuleFunctionHelper<double,double>
                                                    ("std.math",NULLCMath::Sqrt,"sqrt",0);
                                  if (nVar1 == '\0') {
                                    local_9 = false;
                                  }
                                  else {
                                    nullcSetModuleFunctionAttribute("std.math","sqrt",0,0,1);
                                    nVar1 = nullcBindModuleFunctionBuiltin("std.math","sqrt",0,1);
                                    if (nVar1 == '\0') {
                                      local_9 = false;
                                    }
                                    else {
                                      nVar1 = nullcBindModuleFunctionHelper<double,double,double,double>
                                                        ("std.math",NULLCMath::clamp,"clamp",0);
                                      if (nVar1 == '\0') {
                                        local_9 = false;
                                      }
                                      else {
                                        nullcSetModuleFunctionAttribute("std.math","clamp",0,0,1);
                                        nVar1 = nullcBindModuleFunctionHelper<double,double>
                                                          ("std.math",NULLCMath::saturate,"saturate"
                                                           ,0);
                                        if (nVar1 == '\0') {
                                          local_9 = false;
                                        }
                                        else {
                                          nullcSetModuleFunctionAttribute
                                                    ("std.math","saturate",0,0,1);
                                          nVar1 = nullcBindModuleFunctionHelper<double,double>
                                                            ("std.math",NULLCMath::abs,"abs",0);
                                          if (nVar1 == '\0') {
                                            local_9 = false;
                                          }
                                          else {
                                            nullcSetModuleFunctionAttribute("std.math","abs",0,0,1);
                                            nVar1 = 
                                                  nullcBindModuleFunctionHelper<float*,NULLCMath::float2*,unsigned_int>
                                                            ("std.math",NULLCMath::operatorIndex2,
                                                             "[]",0);
                                            if (nVar1 == '\0') {
                                              local_9 = false;
                                            }
                                            else {
                                              nullcSetModuleFunctionAttribute("std.math","[]",0,0,1)
                                              ;
                                              nVar1 = 
                                                  nullcBindModuleFunctionHelper<float*,NULLCMath::float3*,unsigned_int>
                                                            ("std.math",NULLCMath::operatorIndex3,
                                                             "[]",1);
                                              if (nVar1 == '\0') {
                                                local_9 = false;
                                              }
                                              else {
                                                nullcSetModuleFunctionAttribute
                                                          ("std.math","[]",1,0,1);
                                                nVar1 = 
                                                  nullcBindModuleFunctionHelper<float*,NULLCMath::float4*,unsigned_int>
                                                            ("std.math",NULLCMath::operatorIndex4,
                                                             "[]",2);
                                                if (nVar1 == '\0') {
                                                  local_9 = false;
                                                }
                                                else {
                                                  nullcSetModuleFunctionAttribute
                                                            ("std.math","[]",2,0,1);
                                                  nVar1 = 
                                                  nullcBindModuleFunctionHelper<float,NULLCMath::float4*>
                                                            ("std.math",NULLCMath::length2,
                                                             "float2::length",0);
                                                  if (nVar1 == '\0') {
                                                    local_9 = false;
                                                  }
                                                  else {
                                                    nullcSetModuleFunctionAttribute
                                                              ("std.math","float2::length",0,0,1);
                                                    nVar1 = 
                                                  nullcBindModuleFunctionHelper<float,NULLCMath::float4*>
                                                            ("std.math",NULLCMath::normalize2,
                                                             "float2::normalize",0);
                                                  if (nVar1 == '\0') {
                                                    local_9 = false;
                                                  }
                                                  else {
                                                    nullcSetModuleFunctionAttribute
                                                              ("std.math","float2::normalize",0,0,1)
                                                    ;
                                                    nVar1 = 
                                                  nullcBindModuleFunctionHelper<float,NULLCMath::float4*>
                                                            ("std.math",NULLCMath::length3,
                                                             "float3::length",0);
                                                  if (nVar1 == '\0') {
                                                    local_9 = false;
                                                  }
                                                  else {
                                                    nullcSetModuleFunctionAttribute
                                                              ("std.math","float3::length",0,0,1);
                                                    nVar1 = 
                                                  nullcBindModuleFunctionHelper<float,NULLCMath::float4*>
                                                            ("std.math",NULLCMath::normalize3,
                                                             "float3::normalize",0);
                                                  if (nVar1 == '\0') {
                                                    local_9 = false;
                                                  }
                                                  else {
                                                    nullcSetModuleFunctionAttribute
                                                              ("std.math","float3::normalize",0,0,1)
                                                    ;
                                                    nVar1 = 
                                                  nullcBindModuleFunctionHelper<float,NULLCMath::float4*>
                                                            ("std.math",NULLCMath::length3,
                                                             "float4::length",0);
                                                  if (nVar1 == '\0') {
                                                    local_9 = false;
                                                  }
                                                  else {
                                                    nullcSetModuleFunctionAttribute
                                                              ("std.math","float4::length",0,0,1);
                                                    nVar1 = 
                                                  nullcBindModuleFunctionHelper<float,NULLCMath::float4*>
                                                            ("std.math",NULLCMath::normalize3,
                                                             "float4::normalize",0);
                                                  if (nVar1 == '\0') {
                                                    local_9 = false;
                                                  }
                                                  else {
                                                    nullcSetModuleFunctionAttribute
                                                              ("std.math","float4::normalize",0,0,1)
                                                    ;
                                                    nVar1 = 
                                                  nullcBindModuleFunctionHelper<float,NULLCMath::float2*,NULLCMath::float2*>
                                                            ("std.math",NULLCMath::dot2,"dot",0);
                                                  if (nVar1 == '\0') {
                                                    local_9 = false;
                                                  }
                                                  else {
                                                    nullcSetModuleFunctionAttribute
                                                              ("std.math","dot",0,0,1);
                                                    nVar1 = 
                                                  nullcBindModuleFunctionHelper<float,NULLCMath::float3*,NULLCMath::float3*>
                                                            ("std.math",NULLCMath::dot3,"dot",1);
                                                  if (nVar1 == '\0') {
                                                    local_9 = false;
                                                  }
                                                  else {
                                                    nullcSetModuleFunctionAttribute
                                                              ("std.math","dot",1,0,1);
                                                    nVar1 = 
                                                  nullcBindModuleFunctionHelper<float,NULLCMath::float4*,NULLCMath::float4*>
                                                            ("std.math",NULLCMath::dot4,"dot",2);
                                                  if (nVar1 == '\0') {
                                                    local_9 = false;
                                                  }
                                                  else {
                                                    nullcSetModuleFunctionAttribute
                                                              ("std.math","dot",2,0,1);
                                                    local_9 = true;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_9;
}

Assistant:

bool nullcInitMathModule()
{
	REGISTER_PURE_FUNC(Cos, "cos", 0);
	REGISTER_PURE_FUNC(Sin, "sin", 0);
	REGISTER_PURE_FUNC(Tan, "tan", 0);
	REGISTER_PURE_FUNC(Ctg, "ctg", 0);

	REGISTER_PURE_FUNC(Cosh, "cosh", 0);
	REGISTER_PURE_FUNC(Sinh, "sinh", 0);
	REGISTER_PURE_FUNC(Tanh, "tanh", 0);
	REGISTER_PURE_FUNC(Coth, "coth", 0);

	REGISTER_PURE_FUNC(Acos, "acos", 0);
	REGISTER_PURE_FUNC(Asin, "asin", 0);
	REGISTER_PURE_FUNC(Atan, "atan", 0);
	REGISTER_PURE_FUNC(Atan2, "atan2", 0);

	REGISTER_PURE_FUNC(Ceil, "ceil", 0);
	REGISTER_PURE_FUNC(Floor, "floor", 0);
	REGISTER_PURE_FUNC(Exp, "exp", 0);
	REGISTER_PURE_FUNC(Log, "log", 0);

	REGISTER_PURE_FUNC(Sqrt, "sqrt", 0);
	if(!nullcBindModuleFunctionBuiltin("std.math", "sqrt", 0, NULLC_BUILTIN_SQRT)) return false;

	REGISTER_PURE_FUNC(clamp, "clamp", 0);
	REGISTER_PURE_FUNC(saturate, "saturate", 0);
	REGISTER_PURE_FUNC(abs, "abs", 0);

	REGISTER_PURE_FUNC(operatorIndex2, "[]", 0);
	REGISTER_PURE_FUNC(operatorIndex3, "[]", 1);
	REGISTER_PURE_FUNC(operatorIndex4, "[]", 2);

	REGISTER_PURE_FUNC(length2, "float2::length", 0);
	REGISTER_PURE_FUNC(normalize2, "float2::normalize", 0);

	REGISTER_PURE_FUNC(length3, "float3::length", 0);
	REGISTER_PURE_FUNC(normalize3, "float3::normalize", 0);

	REGISTER_PURE_FUNC(length3, "float4::length", 0);
	REGISTER_PURE_FUNC(normalize3, "float4::normalize", 0);

	REGISTER_PURE_FUNC(dot2, "dot", 0);
	REGISTER_PURE_FUNC(dot3, "dot", 1);
	REGISTER_PURE_FUNC(dot4, "dot", 2);

	return true;
}